

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLboolean GVar1;
  int iVar2;
  _GLFWwindow *window;
  GLFWwindow *handle;
  char *format;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  _GLFWfbconfig local_a8;
  _GLFWwndconfig local_60;
  
  if (_glfwInitialized == '\0') {
    iVar2 = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (0 < width && 0 < height) {
      local_a8.redBits = -(uint)(0 < _glfw.hints.redBits) & _glfw.hints.redBits;
      local_a8.greenBits = -(uint)(0 < _glfw.hints.greenBits) & _glfw.hints.greenBits;
      local_a8.blueBits = -(uint)(0 < _glfw.hints.blueBits) & _glfw.hints.blueBits;
      local_a8.alphaBits = -(uint)(0 < _glfw.hints.alphaBits) & _glfw.hints.alphaBits;
      local_a8.depthBits = -(uint)(0 < _glfw.hints.depthBits) & _glfw.hints.depthBits;
      local_a8.stencilBits = -(uint)(0 < _glfw.hints.stencilBits) & _glfw.hints.stencilBits;
      local_a8.accumRedBits = -(uint)(0 < _glfw.hints.accumRedBits) & _glfw.hints.accumRedBits;
      local_a8.accumGreenBits = -(uint)(0 < _glfw.hints.accumGreenBits) & _glfw.hints.accumGreenBits
      ;
      local_a8._32_8_ =
           CONCAT44(-(uint)(0 < _glfw.hints.accumAlphaBits),-(uint)(0 < _glfw.hints.accumBlueBits))
           & _glfw.hints._32_8_;
      local_a8.auxBuffers = _glfw.hints.auxBuffers;
      if (_glfw.hints.auxBuffers < 1) {
        local_a8.auxBuffers = 0;
      }
      local_a8.stereo = _glfw.hints.stereo != '\0';
      local_a8.samples = _glfw.hints.samples;
      if (_glfw.hints.samples < 1) {
        local_a8.samples = 0;
      }
      local_a8.sRGB = _glfw.hints.sRGB != '\0';
      local_60.visible = _glfw.hints.visible != '\0';
      local_60.resizable = _glfw.hints.resizable != '\0';
      local_60.decorated = _glfw.hints.decorated != '\0';
      local_60._20_8_ = _glfw.hints._60_8_;
      local_60.glForward = _glfw.hints.glForward != '\0';
      local_60.glMinor = _glfw.hints.glMinor;
      local_60.glDebug = _glfw.hints.glDebug != '\0';
      local_60._36_8_ = _glfw.hints._76_8_;
      local_60.width = width;
      local_60.height = height;
      local_60.title = title;
      local_60.monitor = (_GLFWmonitor *)monitor;
      local_60.share = (_GLFWwindow *)share;
      GVar1 = _glfwIsValidContextConfig(&local_60);
      if (GVar1 == '\0') {
        return (GLFWwindow *)0x0;
      }
      window = (_GLFWwindow *)calloc(1,0x298);
      window->next = _glfw.windowListHead;
      _glfw.windowListHead = window;
      if (local_60.monitor == (_GLFWmonitor *)0x0) {
        GVar1 = local_60.resizable;
      }
      else {
        local_60.resizable = '\x01';
        local_60.visible = '\x01';
        (window->videoMode).width = width;
        (window->videoMode).height = height;
        uVar3 = -(uint)(0 < _glfw.hints.greenBits) & _glfw.hints.greenBits;
        uVar4 = -(uint)(0 < _glfw.hints.blueBits) & _glfw.hints.blueBits;
        uVar5 = -(uint)(0 < _glfw.hints.refreshRate) & _glfw.hints.refreshRate;
        (window->videoMode).redBits = -(uint)(0 < _glfw.hints.redBits) & _glfw.hints.redBits;
        (window->videoMode).greenBits = uVar3;
        (window->videoMode).blueBits = uVar4;
        (window->videoMode).refreshRate = uVar5;
        GVar1 = '\x01';
      }
      window->monitor = local_60.monitor;
      window->resizable = GVar1;
      window->decorated = local_60.decorated;
      window->cursorMode = 0x34001;
      handle = glfwGetCurrentContext();
      iVar2 = _glfwPlatformCreateWindow(window,&local_60,&local_a8);
      if (iVar2 != 0) {
        glfwMakeContextCurrent((GLFWwindow *)window);
        GVar1 = _glfwRefreshContextAttribs();
        if ((GVar1 != '\0') && (GVar1 = _glfwIsValidContext(&local_60), GVar1 != '\0')) {
          glClear(0x4000);
          _glfwPlatformSwapBuffers(window);
          glfwMakeContextCurrent(handle);
          if (local_60.monitor != (_GLFWmonitor *)0x0) {
            return (GLFWwindow *)window;
          }
          if (local_60.visible == '\0') {
            return (GLFWwindow *)window;
          }
          glfwShowWindow((GLFWwindow *)window);
          return (GLFWwindow *)window;
        }
      }
      glfwDestroyWindow((GLFWwindow *)window);
      glfwMakeContextCurrent(handle);
      return (GLFWwindow *)0x0;
    }
    format = "Invalid window size";
    iVar2 = 0x10004;
  }
  _glfwInputError(iVar2,format);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid window size");
        return NULL;
    }

    // Set up desired framebuffer config
    fbconfig.redBits        = Max(_glfw.hints.redBits, 0);
    fbconfig.greenBits      = Max(_glfw.hints.greenBits, 0);
    fbconfig.blueBits       = Max(_glfw.hints.blueBits, 0);
    fbconfig.alphaBits      = Max(_glfw.hints.alphaBits, 0);
    fbconfig.depthBits      = Max(_glfw.hints.depthBits, 0);
    fbconfig.stencilBits    = Max(_glfw.hints.stencilBits, 0);
    fbconfig.accumRedBits   = Max(_glfw.hints.accumRedBits, 0);
    fbconfig.accumGreenBits = Max(_glfw.hints.accumGreenBits, 0);
    fbconfig.accumBlueBits  = Max(_glfw.hints.accumBlueBits, 0);
    fbconfig.accumAlphaBits = Max(_glfw.hints.accumAlphaBits, 0);
    fbconfig.auxBuffers     = Max(_glfw.hints.auxBuffers, 0);
    fbconfig.stereo         = _glfw.hints.stereo ? GL_TRUE : GL_FALSE;
    fbconfig.samples        = Max(_glfw.hints.samples, 0);
    fbconfig.sRGB           = _glfw.hints.sRGB ? GL_TRUE : GL_FALSE;

    // Set up desired window config
    wndconfig.width         = width;
    wndconfig.height        = height;
    wndconfig.title         = title;
    wndconfig.resizable     = _glfw.hints.resizable ? GL_TRUE : GL_FALSE;
    wndconfig.visible       = _glfw.hints.visible ? GL_TRUE : GL_FALSE;
    wndconfig.decorated     = _glfw.hints.decorated ? GL_TRUE : GL_FALSE;
    wndconfig.clientAPI     = _glfw.hints.clientAPI;
    wndconfig.glMajor       = _glfw.hints.glMajor;
    wndconfig.glMinor       = _glfw.hints.glMinor;
    wndconfig.glForward     = _glfw.hints.glForward ? GL_TRUE : GL_FALSE;
    wndconfig.glDebug       = _glfw.hints.glDebug ? GL_TRUE : GL_FALSE;
    wndconfig.glProfile     = _glfw.hints.glProfile;
    wndconfig.glRobustness  = _glfw.hints.glRobustness;
    wndconfig.monitor       = (_GLFWmonitor*) monitor;
    wndconfig.share         = (_GLFWwindow*) share;

    // Check the OpenGL bits of the window config
    if (!_glfwIsValidContextConfig(&wndconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    if (wndconfig.monitor)
    {
        wndconfig.resizable = GL_TRUE;
        wndconfig.visible   = GL_TRUE;

        // Set up desired video mode
        window->videoMode.width       = width;
        window->videoMode.height      = height;
        window->videoMode.redBits     = Max(_glfw.hints.redBits, 0);
        window->videoMode.greenBits   = Max(_glfw.hints.greenBits, 0);
        window->videoMode.blueBits    = Max(_glfw.hints.blueBits, 0);
        window->videoMode.refreshRate = Max(_glfw.hints.refreshRate, 0);
    }

    window->monitor    = wndconfig.monitor;
    window->resizable  = wndconfig.resizable;
    window->decorated  = wndconfig.decorated;
    window->cursorMode = GLFW_CURSOR_NORMAL;

    // Save the currently current context so it can be restored later
    previous = (_GLFWwindow*) glfwGetCurrentContext();

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        glfwMakeContextCurrent((GLFWwindow*) previous);
        return NULL;
    }

    glfwMakeContextCurrent((GLFWwindow*) window);

    // Retrieve the actual (as opposed to requested) context attributes
    if (!_glfwRefreshContextAttribs())
    {
        glfwDestroyWindow((GLFWwindow*) window);
        glfwMakeContextCurrent((GLFWwindow*) previous);
        return NULL;
    }

    // Verify the context against the requested parameters
    if (!_glfwIsValidContext(&wndconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        glfwMakeContextCurrent((GLFWwindow*) previous);
        return NULL;
    }

    // Clearing the front buffer to black to avoid garbage pixels left over
    // from previous uses of our bit of VRAM
    glClear(GL_COLOR_BUFFER_BIT);
    _glfwPlatformSwapBuffers(window);

    // Restore the previously current context (or NULL)
    glfwMakeContextCurrent((GLFWwindow*) previous);

    if (wndconfig.monitor == NULL && wndconfig.visible)
        glfwShowWindow((GLFWwindow*) window);

    return (GLFWwindow*) window;
}